

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O3

void __thiscall
sentencepiece::unigram::Model::BuildTrie
          (Model *this,
          vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          *pieces)

{
  uint uVar1;
  pointer ppVar2;
  DoubleArrayImpl<void,_void,_int,_void> *pDVar3;
  unit_type *puVar4;
  size_t sVar5;
  byte *pbVar6;
  undefined8 uVar7;
  pointer ppcVar8;
  int iVar9;
  int iVar10;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> *p;
  ulong uVar11;
  DoubleArrayImpl<void,_void,_int,_void> *this_00;
  undefined8 *puVar12;
  pointer ppVar13;
  byte bVar14;
  long lVar15;
  ulong uVar16;
  size_t sVar17;
  value_type *__val;
  bool bVar18;
  string_view error_message;
  string_view error_message_00;
  string_view error_message_01;
  vector<const_char_*,_std::allocator<const_char_*>_> key;
  vector<int,_std::allocator<int>_> value;
  Status SStack_68;
  vector<const_char_*,_std::allocator<const_char_*>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  (*(this->super_ModelInterface)._vptr_ModelInterface[2])(&local_60,this);
  ppcVar8 = local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  util::Status::~Status((Status *)&local_60);
  if (ppcVar8 == (key_type **)0x0) {
    ppVar13 = (pieces->
              super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (pieces->
             super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar13 == ppVar2) {
      error_message_00._M_str = "no pieces are loaded.";
      error_message_00._M_len = 0x15;
      util::Status::Status((Status *)&local_60,kInternal,error_message_00);
      util::Status::operator=(&(this->super_ModelInterface).status_,(Status *)&local_60);
      util::Status::~Status((Status *)&local_60);
    }
    else {
      uVar11 = ((long)ppVar2 - (long)ppVar13 >> 3) * -0x5555555555555555;
      lVar15 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (ppVar13,ppVar2,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (ppVar13,ppVar2);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                (&local_60,
                 ((long)(pieces->
                        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pieces->
                        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
                 (allocator_type *)&local_48);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_48,
                 ((long)(pieces->
                        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pieces->
                        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
                 (allocator_type *)&SStack_68);
      ppVar13 = (pieces->
                super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((pieces->
          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppVar13) {
        lVar15 = 0;
        uVar11 = 0;
        do {
          local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] =
               *(key_type **)((long)&(ppVar13->first)._M_str + lVar15);
          ppVar13 = (pieces->
                    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar11] = *(value_type_conflict1 *)((long)&ppVar13->second + lVar15);
          uVar11 = uVar11 + 1;
          lVar15 = lVar15 + 0x18;
        } while (uVar11 < (ulong)(((long)(pieces->
                                         super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar13
                                  >> 3) * -0x5555555555555555));
      }
      this_00 = (DoubleArrayImpl<void,_void,_int,_void> *)operator_new(0x20);
      this_00->_vptr_DoubleArrayImpl = (_func_int **)&PTR__DoubleArrayImpl_0037d690;
      this_00->size_ = 0;
      this_00->array_ = (unit_type *)0x0;
      this_00->buf_ = (unit_type *)0x0;
      pDVar3 = (this->trie_)._M_t.
               super___uniq_ptr_impl<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
               .super__Head_base<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_false>.
               _M_head_impl;
      (this->trie_)._M_t.
      super___uniq_ptr_impl<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
      .super__Head_base<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_false>._M_head_impl =
           this_00;
      if (pDVar3 != (DoubleArrayImpl<void,_void,_int,_void> *)0x0) {
        (*pDVar3->_vptr_DoubleArrayImpl[1])();
        this_00 = (this->trie_)._M_t.
                  super___uniq_ptr_impl<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                  .super__Head_base<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_false>.
                  _M_head_impl;
      }
      iVar10 = Darts::DoubleArrayImpl<void,_void,_int,_void>::build
                         (this_00,(long)local_60.
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_60.
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3,
                          local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,(size_t *)0x0,
                          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,(progress_func_type)0x0);
      if (iVar10 == 0) {
        puVar12 = (undefined8 *)operator_new(0x4000);
        *puVar12 = 0;
        puVar12[1] = 0;
        lVar15 = 0x10;
        do {
          uVar7 = puVar12[1];
          *(undefined8 *)((long)puVar12 + lVar15) = *puVar12;
          ((undefined8 *)((long)puVar12 + lVar15))[1] = uVar7;
          lVar15 = lVar15 + 0x10;
        } while (lVar15 != 0x4000);
        this->trie_results_size_ = 0;
        ppVar13 = (pieces->
                  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppVar2 = (pieces->
                 super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar13 != ppVar2) {
          puVar4 = ((this->trie_)._M_t.
                    super___uniq_ptr_impl<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
                    .super__Head_base<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_false>.
                   _M_head_impl)->array_;
          iVar10 = 0;
          do {
            sVar5 = (ppVar13->first)._M_len;
            pbVar6 = (byte *)(ppVar13->first)._M_str;
            uVar11 = (ulong)((puVar4->unit_ >> 10) << ((byte)(puVar4->unit_ >> 6) & 8));
            if (sVar5 == 0) {
              bVar14 = *pbVar6;
              if (bVar14 == 0) {
                uVar16 = 0;
              }
              else {
                lVar15 = 1;
                uVar16 = 0;
                do {
                  uVar1 = puVar4[bVar14 ^ uVar11].unit_;
                  if ((uVar1 & 0x800000ff) != (uint)bVar14) break;
                  uVar11 = bVar14 ^ uVar11 ^ (ulong)((uVar1 >> 10) << ((byte)(uVar1 >> 6) & 8));
                  if ((uVar1 >> 8 & 1) != 0) {
                    if (uVar16 < 0x400) {
                      *(id_type *)(puVar12 + uVar16 * 2) = puVar4[uVar11].unit_ & 0x7fffffff;
                      puVar12[uVar16 * 2 + 1] = lVar15;
                    }
                    uVar16 = uVar16 + 1;
                  }
                  bVar14 = pbVar6[lVar15];
                  lVar15 = lVar15 + 1;
                } while (bVar14 != 0);
              }
            }
            else {
              uVar16 = 0;
              sVar17 = 1;
              do {
                uVar11 = pbVar6[sVar17 - 1] ^ uVar11;
                uVar1 = puVar4[uVar11].unit_;
                if ((uVar1 & 0x800000ff) != (uint)pbVar6[sVar17 - 1]) break;
                uVar11 = uVar11 ^ (uVar1 >> 10) << ((byte)(uVar1 >> 6) & 8);
                if ((uVar1 >> 8 & 1) != 0) {
                  if (uVar16 < 0x400) {
                    *(id_type *)(puVar12 + uVar16 * 2) = puVar4[uVar11].unit_ & 0x7fffffff;
                    puVar12[uVar16 * 2 + 1] = sVar17;
                  }
                  uVar16 = uVar16 + 1;
                }
                bVar18 = sVar17 != sVar5;
                sVar17 = sVar17 + 1;
              } while (bVar18);
            }
            iVar9 = (int)uVar16;
            if ((int)uVar16 < iVar10) {
              iVar9 = iVar10;
            }
            iVar10 = iVar9;
            this->trie_results_size_ = iVar10;
            ppVar13 = ppVar13 + 1;
          } while (ppVar13 != ppVar2);
        }
        std::
        _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::clear(&(this->super_ModelInterface).pieces_._M_h);
        if (this->trie_results_size_ == 0) {
          error_message_01._M_str = "no entry is found in the trie.";
          error_message_01._M_len = 0x1e;
          util::Status::Status(&SStack_68,kInternal,error_message_01);
          util::Status::operator=(&(this->super_ModelInterface).status_,&SStack_68);
          util::Status::~Status(&SStack_68);
        }
        operator_delete(puVar12,0x4000);
      }
      else {
        error_message._M_str = "cannot build double-array.";
        error_message._M_len = 0x1a;
        util::Status::Status(&SStack_68,kInternal,error_message);
        util::Status::operator=(&(this->super_ModelInterface).status_,&SStack_68);
        util::Status::~Status(&SStack_68);
      }
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (value_type_conflict1 *)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (key_type **)0x0) {
        operator_delete(local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_60.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void Model::BuildTrie(std::vector<std::pair<absl::string_view, int>> *pieces) {
  if (!status().ok()) return;

  if (pieces->empty()) {
    status_ = util::InternalError("no pieces are loaded.");
    return;
  }

  // sort by sentencepiece since DoubleArray::build()
  // only accepts sorted strings.
  sort(pieces->begin(), pieces->end());

  // Makes key/value set for DoubleArrayTrie.
  std::vector<const char *> key(pieces->size());
  std::vector<int> value(pieces->size());
  for (size_t i = 0; i < pieces->size(); ++i) {
    key[i] = (*pieces)[i].first.data();  // sorted piece.
    value[i] = (*pieces)[i].second;      // vocab_id
  }

  trie_ = std::make_unique<Darts::DoubleArray>();
  if (trie_->build(key.size(), const_cast<char **>(&key[0]), nullptr,
                   &value[0]) != 0) {
    status_ = util::InternalError("cannot build double-array.");
    return;
  }

  // Computes the maximum number of shared prefixes in the trie.
  const int kMaxTrieResultsSize = 1024;
  std::vector<Darts::DoubleArray::result_pair_type> results(
      kMaxTrieResultsSize);
  trie_results_size_ = 0;
  for (const auto &p : *pieces) {
    const int num_nodes = trie_->commonPrefixSearch(
        p.first.data(), results.data(), results.size(), p.first.size());
    trie_results_size_ = std::max(trie_results_size_, num_nodes);
  }

  pieces_.clear();

  if (trie_results_size_ == 0)
    status_ = util::InternalError("no entry is found in the trie.");
}